

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

Result __thiscall wabt::ExprVisitor::HandleDefaultState(ExprVisitor *this,Expr *expr)

{
  Delegate *pDVar1;
  bool bVar2;
  ExprType EVar3;
  Result RVar4;
  BlockExprBase<(wabt::ExprType)8> *pBVar5;
  IfExpr *pIVar6;
  BlockExprBase<(wabt::ExprType)27> *pBVar7;
  TryTableExpr *pTVar8;
  TryExpr *pTVar9;
  TryExpr *try_expr;
  TryTableExpr *try_table_expr;
  BlockExprBase<(wabt::ExprType)27> *loop_expr;
  IfExpr *if_expr;
  BlockExprBase<(wabt::ExprType)8> *block_expr;
  Expr *expr_local;
  ExprVisitor *this_local;
  
  EVar3 = Expr::type(expr);
  switch(EVar3) {
  case AtomicLoad:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)0>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x40])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmw:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x42])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmwCmpxchg:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x43])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicStore:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x41])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicNotify:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)4>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x3f])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicFence:
    pDVar1 = this->delegate_;
    cast<wabt::AtomicFenceExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x3e])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicWait:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)6>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x3d])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Binary:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[2])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Block:
    pBVar5 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[3])(this->delegate_,pBVar5);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,Block,expr,&(pBVar5->block).exprs);
    break;
  case Br:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[5])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrIf:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)10>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[6])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrTable:
    pDVar1 = this->delegate_;
    cast<wabt::BrTableExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[7])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Call:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[10])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case CallIndirect:
    pDVar1 = this->delegate_;
    cast<wabt::CallIndirectExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xb])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case CallRef:
    pDVar1 = this->delegate_;
    cast<wabt::CallRefExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xc])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case CodeMetadata:
    pDVar1 = this->delegate_;
    cast<wabt::CodeMetadataExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xd])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Compare:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)16>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xe])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Const:
    pDVar1 = this->delegate_;
    cast<wabt::ConstExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xf])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Convert:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)18>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x10])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Drop:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)19>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x11])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GlobalGet:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)20>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x12])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GlobalSet:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)21>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x13])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case If:
    pIVar6 = cast<wabt::IfExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[0x14])(this->delegate_,pIVar6);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,IfTrue,expr,&(pIVar6->true_).exprs);
    break;
  case Load:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)23>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x17])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalGet:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x18])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalSet:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)25>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x19])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalTee:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)26>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1a])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Loop:
    pBVar7 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[0x1b])(this->delegate_,pBVar7);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,Loop,expr,&(pBVar7->block).exprs);
    break;
  case MemoryCopy:
    pDVar1 = this->delegate_;
    cast<wabt::MemoryBinaryExpr<(wabt::ExprType)28>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1d])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case DataDrop:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)29>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1e])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryFill:
    pDVar1 = this->delegate_;
    cast<wabt::MemoryExpr<(wabt::ExprType)30>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1f])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryGrow:
    pDVar1 = this->delegate_;
    cast<wabt::MemoryExpr<(wabt::ExprType)31>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x20])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryInit:
    pDVar1 = this->delegate_;
    cast<wabt::MemoryVarExpr<(wabt::ExprType)32>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x21])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemorySize:
    pDVar1 = this->delegate_;
    cast<wabt::MemoryExpr<(wabt::ExprType)33>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x22])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Nop:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)34>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2e])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case RefIsNull:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)35>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2d])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case RefFunc:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2b])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case RefNull:
    pDVar1 = this->delegate_;
    cast<wabt::RefTypeExpr<(wabt::ExprType)37>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2c])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Rethrow:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)38>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x3c])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Return:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)39>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2f])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ReturnCall:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x30])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ReturnCallIndirect:
    pDVar1 = this->delegate_;
    cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x31])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Select:
    pDVar1 = this->delegate_;
    cast<wabt::SelectExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x32])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdLaneOp:
    pDVar1 = this->delegate_;
    cast<wabt::SimdLaneOpExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x45])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdLoadLane:
    pDVar1 = this->delegate_;
    cast<wabt::SimdLoadLaneExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x46])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdStoreLane:
    pDVar1 = this->delegate_;
    cast<wabt::SimdStoreLaneExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x47])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdShuffleOp:
    pDVar1 = this->delegate_;
    cast<wabt::SimdShuffleOpExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x48])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LoadSplat:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)47>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x49])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LoadZero:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)48>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x4a])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Store:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)49>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x33])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableCopy:
    pDVar1 = this->delegate_;
    cast<wabt::TableCopyExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x23])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ElemDrop:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)51>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x24])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableInit:
    pDVar1 = this->delegate_;
    cast<wabt::TableInitExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x25])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableGet:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)53>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x26])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableGrow:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)54>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x28])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableSize:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)55>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x29])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableSet:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)56>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x27])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableFill:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)57>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2a])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Ternary:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)58>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x44])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Throw:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)59>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x3a])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ThrowRef:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)60>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x3b])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Try:
    pTVar9 = cast<wabt::TryExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[0x36])(this->delegate_,pTVar9);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,Try,expr,&(pTVar9->block).exprs);
    break;
  case TryTable:
    pTVar8 = cast<wabt::TryTableExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[8])(this->delegate_,pTVar8);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,TryTable,expr,&(pTVar8->block).exprs);
    break;
  case Unary:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)63>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x34])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Last:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)64>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x35])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result ExprVisitor::HandleDefaultState(Expr* expr) {
  switch (expr->type()) {
    case ExprType::AtomicLoad:
      CHECK_RESULT(delegate_->OnAtomicLoadExpr(cast<AtomicLoadExpr>(expr)));
      break;

    case ExprType::AtomicStore:
      CHECK_RESULT(delegate_->OnAtomicStoreExpr(cast<AtomicStoreExpr>(expr)));
      break;

    case ExprType::AtomicRmw:
      CHECK_RESULT(delegate_->OnAtomicRmwExpr(cast<AtomicRmwExpr>(expr)));
      break;

    case ExprType::AtomicRmwCmpxchg:
      CHECK_RESULT(
          delegate_->OnAtomicRmwCmpxchgExpr(cast<AtomicRmwCmpxchgExpr>(expr)));
      break;

    case ExprType::AtomicWait:
      CHECK_RESULT(delegate_->OnAtomicWaitExpr(cast<AtomicWaitExpr>(expr)));
      break;

    case ExprType::AtomicFence:
      CHECK_RESULT(delegate_->OnAtomicFenceExpr(cast<AtomicFenceExpr>(expr)));
      break;

    case ExprType::AtomicNotify:
      CHECK_RESULT(delegate_->OnAtomicNotifyExpr(cast<AtomicNotifyExpr>(expr)));
      break;

    case ExprType::Binary:
      CHECK_RESULT(delegate_->OnBinaryExpr(cast<BinaryExpr>(expr)));
      break;

    case ExprType::Block: {
      auto block_expr = cast<BlockExpr>(expr);
      CHECK_RESULT(delegate_->BeginBlockExpr(block_expr));
      PushExprlist(State::Block, expr, block_expr->block.exprs);
      break;
    }

    case ExprType::Br:
      CHECK_RESULT(delegate_->OnBrExpr(cast<BrExpr>(expr)));
      break;

    case ExprType::BrIf:
      CHECK_RESULT(delegate_->OnBrIfExpr(cast<BrIfExpr>(expr)));
      break;

    case ExprType::BrTable:
      CHECK_RESULT(delegate_->OnBrTableExpr(cast<BrTableExpr>(expr)));
      break;

    case ExprType::Call:
      CHECK_RESULT(delegate_->OnCallExpr(cast<CallExpr>(expr)));
      break;

    case ExprType::CallIndirect:
      CHECK_RESULT(delegate_->OnCallIndirectExpr(cast<CallIndirectExpr>(expr)));
      break;

    case ExprType::CallRef:
      CHECK_RESULT(delegate_->OnCallRefExpr(cast<CallRefExpr>(expr)));
      break;

    case ExprType::CodeMetadata:
      CHECK_RESULT(delegate_->OnCodeMetadataExpr(cast<CodeMetadataExpr>(expr)));
      break;

    case ExprType::Compare:
      CHECK_RESULT(delegate_->OnCompareExpr(cast<CompareExpr>(expr)));
      break;

    case ExprType::Const:
      CHECK_RESULT(delegate_->OnConstExpr(cast<ConstExpr>(expr)));
      break;

    case ExprType::Convert:
      CHECK_RESULT(delegate_->OnConvertExpr(cast<ConvertExpr>(expr)));
      break;

    case ExprType::Drop:
      CHECK_RESULT(delegate_->OnDropExpr(cast<DropExpr>(expr)));
      break;

    case ExprType::GlobalGet:
      CHECK_RESULT(delegate_->OnGlobalGetExpr(cast<GlobalGetExpr>(expr)));
      break;

    case ExprType::GlobalSet:
      CHECK_RESULT(delegate_->OnGlobalSetExpr(cast<GlobalSetExpr>(expr)));
      break;

    case ExprType::If: {
      auto if_expr = cast<IfExpr>(expr);
      CHECK_RESULT(delegate_->BeginIfExpr(if_expr));
      PushExprlist(State::IfTrue, expr, if_expr->true_.exprs);
      break;
    }

    case ExprType::Load:
      CHECK_RESULT(delegate_->OnLoadExpr(cast<LoadExpr>(expr)));
      break;

    case ExprType::LoadSplat:
      CHECK_RESULT(delegate_->OnLoadSplatExpr(cast<LoadSplatExpr>(expr)));
      break;

    case ExprType::LoadZero:
      CHECK_RESULT(delegate_->OnLoadZeroExpr(cast<LoadZeroExpr>(expr)));
      break;

    case ExprType::LocalGet:
      CHECK_RESULT(delegate_->OnLocalGetExpr(cast<LocalGetExpr>(expr)));
      break;

    case ExprType::LocalSet:
      CHECK_RESULT(delegate_->OnLocalSetExpr(cast<LocalSetExpr>(expr)));
      break;

    case ExprType::LocalTee:
      CHECK_RESULT(delegate_->OnLocalTeeExpr(cast<LocalTeeExpr>(expr)));
      break;

    case ExprType::Loop: {
      auto loop_expr = cast<LoopExpr>(expr);
      CHECK_RESULT(delegate_->BeginLoopExpr(loop_expr));
      PushExprlist(State::Loop, expr, loop_expr->block.exprs);
      break;
    }

    case ExprType::MemoryCopy:
      CHECK_RESULT(delegate_->OnMemoryCopyExpr(cast<MemoryCopyExpr>(expr)));
      break;

    case ExprType::DataDrop:
      CHECK_RESULT(delegate_->OnDataDropExpr(cast<DataDropExpr>(expr)));
      break;

    case ExprType::MemoryFill:
      CHECK_RESULT(delegate_->OnMemoryFillExpr(cast<MemoryFillExpr>(expr)));
      break;

    case ExprType::MemoryGrow:
      CHECK_RESULT(delegate_->OnMemoryGrowExpr(cast<MemoryGrowExpr>(expr)));
      break;

    case ExprType::MemoryInit:
      CHECK_RESULT(delegate_->OnMemoryInitExpr(cast<MemoryInitExpr>(expr)));
      break;

    case ExprType::MemorySize:
      CHECK_RESULT(delegate_->OnMemorySizeExpr(cast<MemorySizeExpr>(expr)));
      break;

    case ExprType::TableCopy:
      CHECK_RESULT(delegate_->OnTableCopyExpr(cast<TableCopyExpr>(expr)));
      break;

    case ExprType::ElemDrop:
      CHECK_RESULT(delegate_->OnElemDropExpr(cast<ElemDropExpr>(expr)));
      break;

    case ExprType::TableInit:
      CHECK_RESULT(delegate_->OnTableInitExpr(cast<TableInitExpr>(expr)));
      break;

    case ExprType::TableGet:
      CHECK_RESULT(delegate_->OnTableGetExpr(cast<TableGetExpr>(expr)));
      break;

    case ExprType::TableSet:
      CHECK_RESULT(delegate_->OnTableSetExpr(cast<TableSetExpr>(expr)));
      break;

    case ExprType::TableGrow:
      CHECK_RESULT(delegate_->OnTableGrowExpr(cast<TableGrowExpr>(expr)));
      break;

    case ExprType::TableSize:
      CHECK_RESULT(delegate_->OnTableSizeExpr(cast<TableSizeExpr>(expr)));
      break;

    case ExprType::TableFill:
      CHECK_RESULT(delegate_->OnTableFillExpr(cast<TableFillExpr>(expr)));
      break;

    case ExprType::RefFunc:
      CHECK_RESULT(delegate_->OnRefFuncExpr(cast<RefFuncExpr>(expr)));
      break;

    case ExprType::RefNull:
      CHECK_RESULT(delegate_->OnRefNullExpr(cast<RefNullExpr>(expr)));
      break;

    case ExprType::RefIsNull:
      CHECK_RESULT(delegate_->OnRefIsNullExpr(cast<RefIsNullExpr>(expr)));
      break;

    case ExprType::Nop:
      CHECK_RESULT(delegate_->OnNopExpr(cast<NopExpr>(expr)));
      break;

    case ExprType::Rethrow:
      CHECK_RESULT(delegate_->OnRethrowExpr(cast<RethrowExpr>(expr)));
      break;

    case ExprType::Return:
      CHECK_RESULT(delegate_->OnReturnExpr(cast<ReturnExpr>(expr)));
      break;

    case ExprType::ReturnCall:
      CHECK_RESULT(delegate_->OnReturnCallExpr(cast<ReturnCallExpr>(expr)));
      break;

    case ExprType::ReturnCallIndirect:
      CHECK_RESULT(delegate_->OnReturnCallIndirectExpr(
          cast<ReturnCallIndirectExpr>(expr)));
      break;

    case ExprType::Select:
      CHECK_RESULT(delegate_->OnSelectExpr(cast<SelectExpr>(expr)));
      break;

    case ExprType::Store:
      CHECK_RESULT(delegate_->OnStoreExpr(cast<StoreExpr>(expr)));
      break;

    case ExprType::Throw:
      CHECK_RESULT(delegate_->OnThrowExpr(cast<ThrowExpr>(expr)));
      break;

    case ExprType::ThrowRef:
      CHECK_RESULT(delegate_->OnThrowRefExpr(cast<ThrowRefExpr>(expr)));
      break;

    case ExprType::TryTable: {
      auto try_table_expr = cast<TryTableExpr>(expr);
      CHECK_RESULT(delegate_->BeginTryTableExpr(try_table_expr));
      PushExprlist(State::TryTable, expr, try_table_expr->block.exprs);
      break;
    }

    case ExprType::Try: {
      auto try_expr = cast<TryExpr>(expr);
      CHECK_RESULT(delegate_->BeginTryExpr(try_expr));
      PushExprlist(State::Try, expr, try_expr->block.exprs);
      break;
    }

    case ExprType::Unary:
      CHECK_RESULT(delegate_->OnUnaryExpr(cast<UnaryExpr>(expr)));
      break;

    case ExprType::Ternary:
      CHECK_RESULT(delegate_->OnTernaryExpr(cast<TernaryExpr>(expr)));
      break;

    case ExprType::SimdLaneOp: {
      CHECK_RESULT(delegate_->OnSimdLaneOpExpr(cast<SimdLaneOpExpr>(expr)));
      break;
    }

    case ExprType::SimdLoadLane: {
      CHECK_RESULT(delegate_->OnSimdLoadLaneExpr(cast<SimdLoadLaneExpr>(expr)));
      break;
    }

    case ExprType::SimdStoreLane: {
      CHECK_RESULT(
          delegate_->OnSimdStoreLaneExpr(cast<SimdStoreLaneExpr>(expr)));
      break;
    }

    case ExprType::SimdShuffleOp: {
      CHECK_RESULT(
          delegate_->OnSimdShuffleOpExpr(cast<SimdShuffleOpExpr>(expr)));
      break;
    }

    case ExprType::Unreachable:
      CHECK_RESULT(delegate_->OnUnreachableExpr(cast<UnreachableExpr>(expr)));
      break;
  }

  return Result::Ok;
}